

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

void p2sc_dctm(double *m,int N)

{
  int in_ESI;
  long in_RDI;
  double dVar1;
  double dVar2;
  double s2;
  double s1;
  int j;
  int i;
  undefined4 local_14;
  undefined4 local_10;
  
  dVar1 = sqrt((double)in_ESI);
  dVar2 = sqrt((double)in_ESI);
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    *(double *)(in_RDI + (long)local_10 * 8) = 1.0 / dVar1;
  }
  for (local_14 = 1; local_14 < in_ESI; local_14 = local_14 + 1) {
    for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
      dVar1 = cos(((double)(local_10 * 2 + 1) * 3.141592653589793 * (double)local_14) /
                  (double)(in_ESI << 1));
      *(double *)(in_RDI + (long)(local_14 * in_ESI + local_10) * 8) =
           (1.4142135623730951 / dVar2) * dVar1;
    }
  }
  return;
}

Assistant:

void p2sc_dctm(double *m, int N) {
    int i, j;
    double s1 = 1 / sqrt(N), s2 = M_SQRT2 / sqrt(N);

    for (i = 0; i < N; ++i)
        m[i] = s1;
    for (j = 1; j < N; ++j)
        for (i = 0; i < N; ++i)
            m[j * N + i] = s2 * cos(M_PI * (2 * i + 1) * j / (2 * N));
}